

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O2

string * __thiscall
iDynTree::Direction::toString_abi_cxx11_(string *__return_storage_ptr__,Direction *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188," x ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Vector3).m_data[0]);
  std::operator<<(poVar1," y ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Vector3).m_data[1]);
  std::operator<<(poVar1," z ");
  std::ostream::_M_insert<double>((this->super_Vector3).m_data[2]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Direction::toString() const
    {
        std::stringstream ss;

        ss << " x " << this->m_data[0]
        << " y " << this->m_data[1]
        << " z " << this->m_data[2];

        return ss.str();
    }